

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_stage6_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  uint uVar25;
  undefined4 uVar26;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_548;
  undefined2 uStack_546;
  undefined2 uStack_544;
  undefined2 uStack_542;
  undefined2 local_538;
  undefined2 uStack_536;
  undefined2 uStack_534;
  undefined2 uStack_532;
  undefined2 local_528;
  undefined2 uStack_526;
  undefined2 uStack_524;
  undefined2 uStack_522;
  undefined2 local_518;
  undefined2 uStack_516;
  undefined2 uStack_514;
  undefined2 uStack_512;
  undefined2 uStack_500;
  undefined2 uStack_4fe;
  undefined2 uStack_4fc;
  undefined2 uStack_4fa;
  undefined2 uStack_4f0;
  undefined2 uStack_4ee;
  undefined2 uStack_4ec;
  undefined2 uStack_4ea;
  undefined2 uStack_4e0;
  undefined2 uStack_4de;
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  undefined2 uStack_4d0;
  undefined2 uStack_4ce;
  undefined2 uStack_4cc;
  undefined2 uStack_4ca;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int local_378;
  int iStack_374;
  int iStack_370;
  int iStack_36c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  
  uVar25 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar21 = CONCAT44(uVar25,uVar25);
  uVar22 = CONCAT44(uVar25,uVar25);
  uVar26 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  uVar23 = CONCAT44(uVar26,uVar26);
  uVar24 = CONCAT44(uVar26,uVar26);
  auVar28 = *in_RDI;
  auVar27 = paddsw(*in_RDI,in_RDI[7]);
  *in_RDI = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[7]);
  in_RDI[7] = auVar28;
  auVar28 = in_RDI[1];
  auVar27 = paddsw(in_RDI[1],in_RDI[6]);
  in_RDI[1] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[6]);
  in_RDI[6] = auVar28;
  auVar28 = in_RDI[2];
  auVar27 = paddsw(in_RDI[2],in_RDI[5]);
  in_RDI[2] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[5]);
  in_RDI[5] = auVar28;
  auVar28 = in_RDI[3];
  auVar27 = paddsw(in_RDI[3],in_RDI[4]);
  in_RDI[3] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[4]);
  in_RDI[4] = auVar28;
  uVar1 = *(undefined8 *)in_RDI[10];
  uVar2 = *(undefined8 *)in_RDI[0xd];
  local_518 = (undefined2)uVar1;
  uStack_516 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_514 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_512 = (undefined2)((ulong)uVar1 >> 0x30);
  local_528 = (undefined2)uVar2;
  uStack_526 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_524 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_522 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[10] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0xd] + 8);
  uStack_4d0 = (undefined2)uVar1;
  uStack_4ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_4cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_4ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_4e0 = (undefined2)uVar2;
  uStack_4de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_4dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_4da = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_528;
  auVar12._0_2_ = local_518;
  auVar12._4_2_ = uStack_516;
  auVar12._6_2_ = uStack_526;
  auVar12._10_2_ = uStack_524;
  auVar12._8_2_ = uStack_514;
  auVar12._12_2_ = uStack_512;
  auVar12._14_2_ = uStack_522;
  auVar11._8_8_ = uVar22;
  auVar11._0_8_ = uVar21;
  auVar28 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_4e0;
  auVar10._0_2_ = uStack_4d0;
  auVar10._4_2_ = uStack_4ce;
  auVar10._6_2_ = uStack_4de;
  auVar10._10_2_ = uStack_4dc;
  auVar10._8_2_ = uStack_4cc;
  auVar10._12_2_ = uStack_4ca;
  auVar10._14_2_ = uStack_4da;
  auVar9._8_8_ = uVar22;
  auVar9._0_8_ = uVar21;
  auVar27 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_528;
  auVar8._0_2_ = local_518;
  auVar8._4_2_ = uStack_516;
  auVar8._6_2_ = uStack_526;
  auVar8._10_2_ = uStack_524;
  auVar8._8_2_ = uStack_514;
  auVar8._12_2_ = uStack_512;
  auVar8._14_2_ = uStack_522;
  auVar7._8_8_ = uVar24;
  auVar7._0_8_ = uVar23;
  auVar29 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_4e0;
  auVar6._0_2_ = uStack_4d0;
  auVar6._4_2_ = uStack_4ce;
  auVar6._6_2_ = uStack_4de;
  auVar6._10_2_ = uStack_4dc;
  auVar6._8_2_ = uStack_4cc;
  auVar6._12_2_ = uStack_4ca;
  auVar6._14_2_ = uStack_4da;
  auVar5._8_8_ = uVar24;
  auVar5._0_8_ = uVar23;
  auVar30 = pmaddwd(auVar6,auVar5);
  local_2d8 = auVar28._0_4_;
  iStack_2d4 = auVar28._4_4_;
  iStack_2d0 = auVar28._8_4_;
  iStack_2cc = auVar28._12_4_;
  local_2e8 = (int)in_XMM0_Qa;
  iStack_2e4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_2e0 = (int)in_XMM0_Qb;
  iStack_2dc = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_2f8 = auVar27._0_4_;
  iStack_2f4 = auVar27._4_4_;
  iStack_2f0 = auVar27._8_4_;
  iStack_2ec = auVar27._12_4_;
  local_318 = auVar29._0_4_;
  iStack_314 = auVar29._4_4_;
  iStack_310 = auVar29._8_4_;
  iStack_30c = auVar29._12_4_;
  local_338 = auVar30._0_4_;
  iStack_334 = auVar30._4_4_;
  iStack_330 = auVar30._8_4_;
  iStack_32c = auVar30._12_4_;
  auVar28 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar29 = ZEXT416((uint)(int)in_DL);
  auVar30 = ZEXT416((uint)(int)in_DL);
  auVar20._4_4_ = iStack_2d4 + iStack_2e4 >> auVar28;
  auVar20._0_4_ = local_2d8 + local_2e8 >> auVar28;
  auVar20._12_4_ = iStack_2cc + iStack_2dc >> auVar28;
  auVar20._8_4_ = iStack_2d0 + iStack_2e0 >> auVar28;
  auVar19._4_4_ = iStack_2f4 + iStack_2e4 >> auVar27;
  auVar19._0_4_ = local_2f8 + local_2e8 >> auVar27;
  auVar19._12_4_ = iStack_2ec + iStack_2dc >> auVar27;
  auVar19._8_4_ = iStack_2f0 + iStack_2e0 >> auVar27;
  auVar28 = packssdw(auVar20,auVar19);
  in_RDI[10] = auVar28;
  auVar18._4_4_ = iStack_314 + iStack_2e4 >> auVar29;
  auVar18._0_4_ = local_318 + local_2e8 >> auVar29;
  auVar18._12_4_ = iStack_30c + iStack_2dc >> auVar29;
  auVar18._8_4_ = iStack_310 + iStack_2e0 >> auVar29;
  auVar17._4_4_ = iStack_334 + iStack_2e4 >> auVar30;
  auVar17._0_4_ = local_338 + local_2e8 >> auVar30;
  auVar17._12_4_ = iStack_32c + iStack_2dc >> auVar30;
  auVar17._8_4_ = iStack_330 + iStack_2e0 >> auVar30;
  auVar28 = packssdw(auVar18,auVar17);
  in_RDI[0xd] = auVar28;
  uVar1 = *(undefined8 *)in_RDI[0xb];
  uVar2 = *(undefined8 *)in_RDI[0xc];
  local_538 = (undefined2)uVar1;
  uStack_536 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_534 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_532 = (undefined2)((ulong)uVar1 >> 0x30);
  local_548 = (undefined2)uVar2;
  uStack_546 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_544 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_542 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0xb] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0xc] + 8);
  uStack_4f0 = (undefined2)uVar1;
  uStack_4ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_4ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_4ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_500 = (undefined2)uVar2;
  uStack_4fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_4fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_4fa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_548;
  auVar4._0_2_ = local_538;
  auVar4._4_2_ = uStack_536;
  auVar4._6_2_ = uStack_546;
  auVar4._10_2_ = uStack_544;
  auVar4._8_2_ = uStack_534;
  auVar4._12_2_ = uStack_532;
  auVar4._14_2_ = uStack_542;
  auVar31._8_8_ = uVar22;
  auVar31._0_8_ = uVar21;
  auVar31 = pmaddwd(auVar4,auVar31);
  auVar3._2_2_ = uStack_500;
  auVar3._0_2_ = uStack_4f0;
  auVar3._4_2_ = uStack_4ee;
  auVar3._6_2_ = uStack_4fe;
  auVar3._10_2_ = uStack_4fc;
  auVar3._8_2_ = uStack_4ec;
  auVar3._12_2_ = uStack_4ea;
  auVar3._14_2_ = uStack_4fa;
  auVar32._8_8_ = uVar22;
  auVar32._0_8_ = uVar21;
  auVar32 = pmaddwd(auVar3,auVar32);
  auVar30._2_2_ = local_548;
  auVar30._0_2_ = local_538;
  auVar30._4_2_ = uStack_536;
  auVar30._6_2_ = uStack_546;
  auVar30._10_2_ = uStack_544;
  auVar30._8_2_ = uStack_534;
  auVar30._12_2_ = uStack_532;
  auVar30._14_2_ = uStack_542;
  auVar29._8_8_ = uVar24;
  auVar29._0_8_ = uVar23;
  auVar29 = pmaddwd(auVar30,auVar29);
  auVar27._2_2_ = uStack_500;
  auVar27._0_2_ = uStack_4f0;
  auVar27._4_2_ = uStack_4ee;
  auVar27._6_2_ = uStack_4fe;
  auVar27._10_2_ = uStack_4fc;
  auVar27._8_2_ = uStack_4ec;
  auVar27._12_2_ = uStack_4ea;
  auVar27._14_2_ = uStack_4fa;
  auVar28._8_8_ = uVar24;
  auVar28._0_8_ = uVar23;
  auVar28 = pmaddwd(auVar27,auVar28);
  local_358 = auVar31._0_4_;
  iStack_354 = auVar31._4_4_;
  iStack_350 = auVar31._8_4_;
  iStack_34c = auVar31._12_4_;
  local_378 = auVar32._0_4_;
  iStack_374 = auVar32._4_4_;
  iStack_370 = auVar32._8_4_;
  iStack_36c = auVar32._12_4_;
  local_398 = auVar29._0_4_;
  iStack_394 = auVar29._4_4_;
  iStack_390 = auVar29._8_4_;
  iStack_38c = auVar29._12_4_;
  local_3b8 = auVar28._0_4_;
  iStack_3b4 = auVar28._4_4_;
  iStack_3b0 = auVar28._8_4_;
  iStack_3ac = auVar28._12_4_;
  auVar28 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar29 = ZEXT416((uint)(int)in_DL);
  auVar30 = ZEXT416((uint)(int)in_DL);
  auVar16._4_4_ = iStack_354 + iStack_2e4 >> auVar28;
  auVar16._0_4_ = local_358 + local_2e8 >> auVar28;
  auVar16._12_4_ = iStack_34c + iStack_2dc >> auVar28;
  auVar16._8_4_ = iStack_350 + iStack_2e0 >> auVar28;
  auVar15._4_4_ = iStack_374 + iStack_2e4 >> auVar27;
  auVar15._0_4_ = local_378 + local_2e8 >> auVar27;
  auVar15._12_4_ = iStack_36c + iStack_2dc >> auVar27;
  auVar15._8_4_ = iStack_370 + iStack_2e0 >> auVar27;
  auVar28 = packssdw(auVar16,auVar15);
  in_RDI[0xb] = auVar28;
  auVar14._4_4_ = iStack_394 + iStack_2e4 >> auVar29;
  auVar14._0_4_ = local_398 + local_2e8 >> auVar29;
  auVar14._12_4_ = iStack_38c + iStack_2dc >> auVar29;
  auVar14._8_4_ = iStack_390 + iStack_2e0 >> auVar29;
  auVar13._4_4_ = iStack_3b4 + iStack_2e4 >> auVar30;
  auVar13._0_4_ = local_3b8 + local_2e8 >> auVar30;
  auVar13._12_4_ = iStack_3ac + iStack_2dc >> auVar30;
  auVar13._8_4_ = iStack_3b0 + iStack_2e0 >> auVar30;
  auVar28 = packssdw(auVar14,auVar13);
  in_RDI[0xc] = auVar28;
  return;
}

Assistant:

static inline void idct16_stage6_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
}